

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::accessChainLoad
          (Builder *this,Decoration precision,Decoration l_nonUniform,Decoration r_nonUniform,
          Id resultType,MemoryAccessMask memoryAccess,Scope scope,uint alignment)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  StorageClass SVar5;
  Id IVar6;
  Id IVar7;
  uint *puVar8;
  ulong uVar9;
  pointer ppIVar10;
  MemoryAccessMask memoryAccess_00;
  long lVar11;
  ulong uVar12;
  Instruction *pIVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if ((this->accessChain).isRValue != true) {
    transferAccessChainSwizzle(this,true);
    pIVar13 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[(this->accessChain).base];
    if (pIVar13 == (Instruction *)0x0) {
      IVar6 = 0;
    }
    else {
      IVar6 = pIVar13->typeId;
    }
    SVar5 = Module::getStorageClass(&this->module,IVar6);
    memoryAccess_00 = memoryAccess | Aligned;
    if (SVar5 != PhysicalStorageBuffer) {
      memoryAccess_00 = memoryAccess;
    }
    IVar6 = collapseAccessChain(this);
    addDecoration(this,IVar6,l_nonUniform,-1);
    IVar6 = createLoad(this,IVar6,precision,memoryAccess_00,scope,-alignment & alignment);
    addDecoration(this,IVar6,r_nonUniform,-1);
    goto LAB_00464d82;
  }
  transferAccessChainSwizzle(this,false);
  puVar8 = (this->accessChain).indexChain.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(this->accessChain).indexChain.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar8;
  if (uVar9 == 0) {
    IVar6 = (this->accessChain).base;
    goto LAB_00464d82;
  }
  IVar6 = (this->accessChain).preSwizzleBaseType;
  if (IVar6 == 0) {
    IVar6 = resultType;
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if ((int)(uVar9 >> 2) < 1) {
LAB_00464bf2:
    IVar6 = createCompositeExtract(this,(this->accessChain).base,IVar6,&local_48);
    if ((precision != DecorationMax) && (IVar6 != 0)) {
      addDecoration(this,IVar6,precision,-1);
    }
  }
  else {
    uVar12 = (ulong)*puVar8;
    ppIVar10 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppIVar10[uVar12]->opCode == OpConstant) {
      lVar11 = 1;
      do {
        local_4c = getConstantScalar(this,(Id)uVar12);
        if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_4c);
        }
        else {
          *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_4c;
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        puVar8 = (this->accessChain).indexChain.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (long)(this->accessChain).indexChain.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar8;
        if ((int)(uVar9 >> 2) <= lVar11) goto LAB_00464bf2;
        uVar12 = (ulong)puVar8[lVar11];
        ppIVar10 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 1;
      } while (ppIVar10[uVar12]->opCode == OpConstant);
    }
    uVar1 = (this->accessChain).base;
    pIVar13 = ppIVar10[uVar1];
    if (pIVar13 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar13->typeId;
    }
    if (ppIVar10[uVar12]->opCode == OpTypeCooperativeVectorNV) {
      if (uVar9 != 4) {
        __assert_fail("accessChain.indexChain.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xfde,
                      "Id spv::Builder::accessChainLoad(Decoration, Decoration, Decoration, Id, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                     );
      }
      IVar6 = createVectorExtractDynamic(this,uVar1,resultType,*puVar8);
    }
    else {
      if (this->spvVersion < 0x10400) {
LAB_00464cb3:
        if (pIVar13 == (Instruction *)0x0) {
          IVar6 = 0;
        }
        else {
          IVar6 = pIVar13->typeId;
        }
        IVar6 = createVariable(this,DecorationMax,Function,IVar6,"indexable",0,true);
        createStore(this,(this->accessChain).base,IVar6,MaskNone,Max,0);
      }
      else {
        bVar4 = isValidInitializer(this,uVar1);
        uVar1 = (this->accessChain).base;
        pIVar13 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar1];
        if (!bVar4) goto LAB_00464cb3;
        if (pIVar13 == (Instruction *)0x0) {
          IVar6 = 0;
        }
        else {
          IVar6 = pIVar13->typeId;
        }
        IVar6 = createVariable(this,DecorationMax,Function,IVar6,"indexable",uVar1,true);
        addDecoration(this,IVar6,DecorationNonWritable,-1);
      }
      (this->accessChain).base = IVar6;
      (this->accessChain).isRValue = false;
      IVar6 = collapseAccessChain(this);
      IVar6 = createLoad(this,IVar6,precision,MaskNone,Max,0);
    }
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00464d82:
  puVar2 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar7 = (this->accessChain).component;
  if (puVar3 != puVar2 || IVar7 != 0) {
    if (puVar3 != puVar2) {
      pIVar13 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[IVar6];
      if (pIVar13 == (Instruction *)0x0) {
        IVar7 = 0;
      }
      else {
        IVar7 = pIVar13->typeId;
      }
      IVar7 = getScalarTypeId(this,IVar7);
      uVar9 = (long)(this->accessChain).swizzle.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->accessChain).swizzle.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (1 < uVar9) {
        IVar7 = makeVectorType(this,IVar7,(int)uVar9);
      }
      IVar6 = createRvalueSwizzle(this,precision,IVar7,IVar6,&(this->accessChain).swizzle);
      IVar7 = (this->accessChain).component;
    }
    if (((IVar7 != 0) &&
        (IVar6 = createVectorExtractDynamic(this,IVar6,resultType,IVar7), precision != DecorationMax
        )) && (IVar6 != 0)) {
      addDecoration(this,IVar6,precision,-1);
    }
    addDecoration(this,IVar6,r_nonUniform,-1);
  }
  return IVar6;
}

Assistant:

Id Builder::accessChainLoad(Decoration precision, Decoration l_nonUniform,
    Decoration r_nonUniform, Id resultType, spv::MemoryAccessMask memoryAccess,
    spv::Scope scope, unsigned int alignment)
{
    Id id;

    if (accessChain.isRValue) {
        // transfer access chain, but try to stay in registers
        transferAccessChainSwizzle(false);
        if (accessChain.indexChain.size() > 0) {
            Id swizzleBase = accessChain.preSwizzleBaseType != NoType ? accessChain.preSwizzleBaseType : resultType;

            // if all the accesses are constants, we can use OpCompositeExtract
            std::vector<unsigned> indexes;
            bool constant = true;
            for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
                if (isConstantScalar(accessChain.indexChain[i]))
                    indexes.push_back(getConstantScalar(accessChain.indexChain[i]));
                else {
                    constant = false;
                    break;
                }
            }

            if (constant) {
                id = createCompositeExtract(accessChain.base, swizzleBase, indexes);
                setPrecision(id, precision);
            } else if (isCooperativeVector(accessChain.base)) {
                assert(accessChain.indexChain.size() == 1);
                id = createVectorExtractDynamic(accessChain.base, resultType, accessChain.indexChain[0]);
            } else {
                Id lValue = NoResult;
                if (spvVersion >= Spv_1_4 && isValidInitializer(accessChain.base)) {
                    // make a new function variable for this r-value, using an initializer,
                    // and mark it as NonWritable so that downstream it can be detected as a lookup
                    // table
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable", accessChain.base);
                    addDecoration(lValue, DecorationNonWritable);
                } else {
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable");
                    // store into it
                    createStore(accessChain.base, lValue);
                }
                // move base to the new variable
                accessChain.base = lValue;
                accessChain.isRValue = false;

                // load through the access chain
                id = createLoad(collapseAccessChain(), precision);
            }
        } else
            id = accessChain.base;  // no precision, it was set when this was defined
    } else {
        transferAccessChainSwizzle(true);

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(accessChain.base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        // load through the access chain
        id = collapseAccessChain();
        // Apply nonuniform both to the access chain and the loaded value.
        // Buffer accesses need the access chain decorated, and this is where
        // loaded image types get decorated. TODO: This should maybe move to
        // createImageTextureFunctionCall.
        addDecoration(id, l_nonUniform);
        id = createLoad(id, precision, memoryAccess, scope, alignment);
        addDecoration(id, r_nonUniform);
    }

    // Done, unless there are swizzles to do
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return id;

    // Do remaining swizzling

    // Do the basic swizzle
    if (accessChain.swizzle.size() > 0) {
        Id swizzledType = getScalarTypeId(getTypeId(id));
        if (accessChain.swizzle.size() > 1)
            swizzledType = makeVectorType(swizzledType, (int)accessChain.swizzle.size());
        id = createRvalueSwizzle(precision, swizzledType, id, accessChain.swizzle);
    }

    // Do the dynamic component
    if (accessChain.component != NoResult)
        id = setPrecision(createVectorExtractDynamic(id, resultType, accessChain.component), precision);

    addDecoration(id, r_nonUniform);
    return id;
}